

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expreval.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  int iVar5;
  int interactive_flag;
  int option_index;
  CustomOperator custom_operator;
  size_t n_arg;
  string str;
  Expression expr;
  ulong local_158 [4];
  string local_138 [4];
  undefined1 local_b0 [16];
  undefined **local_a0;
  undefined1 *local_98;
  allocator local_90 [16];
  string local_80;
  Expression local_60;
  
  local_60.m_expression._M_dataplus._M_p = (pointer)&local_60.m_expression.field_2;
  local_60.m_expression._M_string_length = 0;
  local_60.m_expression.field_2._M_local_buf[0] = '\0';
  local_60.is_calculated = false;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  do {
    if (main::long_options == '\0') {
      main_cold_1();
    }
    local_158[0] = local_158[0] & 0xffffffff00000000;
    iVar3 = getopt_long(argc,argv,"i:",main::long_options,local_158);
    if (iVar3 < 0x3f) {
      iVar5 = 3;
      if (iVar3 != -1) {
        if (iVar3 != 0) {
LAB_001085f7:
          abort();
        }
        if (main::long_options[(int)local_158[0]].flag == (int *)0x0) {
          printf("option %s",main::long_options[(int)local_158[0]].name);
          if (_optarg != (char *)0x0) {
            printf(" with arg %s");
          }
          putchar(10);
        }
LAB_00107aa8:
        iVar5 = 0;
      }
    }
    else {
      if (iVar3 == 0x3f) goto LAB_00107aa8;
      if (iVar3 != 0x69) goto LAB_001085f7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
      std::__cxx11::string::string((string *)local_138,_optarg,local_90);
      dVar1 = ExprEval::Expression::evaluate(&local_60,local_138);
      poVar4 = std::ostream::_M_insert<double>(dVar1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
        operator_delete(local_138[0]._M_dataplus._M_p);
      }
      iVar5 = 1;
    }
    if (iVar5 != 0) {
      if (iVar5 == 3) {
        if (_optind < argc) {
          printf("non-option ARGV-elements: ");
          iVar3 = _optind;
          while (iVar3 < argc) {
            _optind = iVar3 + 1;
            printf("%s ",argv[iVar3]);
            iVar3 = _optind;
          }
          _optind = iVar3;
          putchar(10);
        }
        local_98 = local_b0;
        local_a0 = &PTR__CustomOperator_00115cd0;
        while( true ) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
          cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + ' ');
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&local_80,cVar2);
          if (*local_80._M_dataplus._M_p == 'q') break;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
          dVar1 = ExprEval::Expression::evaluate(&local_60,&local_80);
          poVar4 = std::ostream::_M_insert<double>(dVar1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
          std::ostream::put((char)poVar4);
          std::ostream::flush();
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.m_expression._M_dataplus._M_p != &local_60.m_expression.field_2) {
        operator_delete(local_60.m_expression._M_dataplus._M_p);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv){
    ExprEval::Expression expr;
    string str;

    // ExprEval::Function f({"x", "y"}, "x*y/100");
    // ExprEval::Function g({"x[0]", "x[1]"}, f.get({"x[0]-x[1]", "80-x[1]"}) + "+x[0]*x[1]");

    // try
    // {
    //     cout << f.get({4, 50}) << " = " << f({4, 50}) << endl;
    //     cout << g.get({4, 50}) << " = " << g({4, 50}) << endl;

    //     g.set({"x"}, "3*x+2");
    //     cout << g.get({4}) << " = " << g({4}) << endl;
    // }
    // catch(const ExprEval::Engine::Exception& e)
    // {
    //     std::cerr << e.what() << '\n';
    // }

    int c;
    int interactive_flag = 0;

    while (1){
        static struct option long_options[] =
        {
            {"interactive",   no_argument,       &interactive_flag, 1},
            {0, 0, 0, 0}
        };
    
        /* getopt_long stores the option index here. */
        int option_index = 0;
        c = getopt_long(argc, argv, "i:", long_options, &option_index);

        /* Detect the end of the options. */
        if (c == -1)
            break;

        switch (c)
            {
            case 0:
            /* If this option set a flag, do nothing else now. */
                if (long_options[option_index].flag != 0)
                    break;
                printf ("option %s", long_options[option_index].name);
                if (optarg)
                    printf (" with arg %s", optarg);
                printf ("\n");
                break;

            case 'i':
                cout << " = " << expr.evaluate(string(optarg)) << endl;
                // puts ("option -i\n");
                return 0;

            case '?':
                /* getopt_long already printed an error message. */
                break;

            default:
                abort ();
            }
        }

    /* Print any remaining command line arguments (not options). */
    if (optind < argc)
    {
        printf ("non-option ARGV-elements: ");
        while (optind < argc)
            printf ("%s ", argv[optind++]);
        putchar ('\n');
    }

    if(interactive_flag){
        cout << "(Enter 'h' for help)" << endl;
    }

    while(1){
        cout<<": ";
        getline(cin, str);
        if(str[0] == 'q') break;
        else if(str[0] == '>' && interactive_flag){
            ExprEval::Operator::CustomOperator custom_operator;
            size_t n_arg;

            cout<<"\t> Symbol: ";
            cin>>custom_operator.symbol;
            cout<<"\t> # Args: ";
            cin>>n_arg;
            for(size_t i=1; i<=n_arg; ++i){
                cout<<"\t> Variable ["<<i<<"]: ";
                string arg;
                cin>>arg;
                if(arg.back() != '_'){
                    cout<<" ! [Variable names should end with underscore(_)]\n";
                    i -= 1;
                    continue;
                }
                custom_operator.arg_positions.push_back(i);
                custom_operator.variables.push_back(arg);
            }
            cout<<"\t> Expression: ";
            cin>>custom_operator.expression;

            ExprEval::Operator::add_custom_operator(custom_operator);
            cout<<"= = = = = = = = = = = = = =\n";
            cin.ignore();
            continue;
        } else if(str[0] == '<' && interactive_flag){
            string symbol;
            cout<<" < Symbol: ";
            cin>>symbol;
            ExprEval::Operator::remove_custom_operator(symbol);
            cout<<"= = = = = = = = = = = = = =\n";
            cin.ignore();
            continue;
        } else if(str[0] == '?' && interactive_flag){
            auto custom_table = ExprEval::Operator::get_custom_table();
            for(size_t i=0; i<custom_table->size(); ++i){
                auto custom_operator = custom_table->at(i);
                auto args = custom_operator.variables;

                cout<<"\t- "<<custom_operator.symbol<<"(";
                for(size_t j=0; j<args.size(); ++j){
                    cout<<args[j];
                    if(j < args.size()-1) cout<<", ";
                }
                cout<<") = "<<custom_operator.expression<<endl;
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 's' && interactive_flag){
            string file_path;

            cout << "\t[w] File path(default: operators.spec): ";
            getline(cin, file_path);
            if(file_path.empty()) file_path = DEFAULT_SPECIFICATION_FILE_PATH;

            try
            {
                ExprEval::Operator::BaseSpecification::write(file_path);
            }
            catch(const std::exception& e)
            {
                std::cerr << e.what() << '\n';
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 'l' && interactive_flag){
            string file_path;

            cout << "\t[r] File path(default: operators.spec): ";
            getline(cin, file_path);
            if(file_path.empty()) file_path = DEFAULT_SPECIFICATION_FILE_PATH;

            try
            {
                ExprEval::Operator::BaseSpecification::read(file_path);
            }
            catch(const std::exception& e)
            {
                std::cerr << e.what() << '\n';
            }
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        } else if(str[0] == 'h' && interactive_flag){
            cout << "\t| Use '>' to add a new operator/function;" << endl;
            cout << "\t| Use '<' to remove an operator/function;" << endl;
            cout << "\t| Use '?' to list all the user-defined operators/functions;" << endl;
            cout << "\t| Use 's' to save all the user-defined operators/functions;" << endl;
            cout << "\t| Use 'l' to load all the user-defined operators/functions;" << endl;
            cout << "\t| Use 'q' to quit." << endl;
            cout<<"= = = = = = = = = = = = = =\n";
            continue;
        }
        
        try
        {
            cout<<" = "<<expr.evaluate(str)<<endl;
        }
        catch(const ExprEval::Engine::Exception& e)
        {
            std::cerr << e.what() << '\n';
        }
    }

    return 0;
}